

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_array_remove(JSON_Array *array,size_t ix)

{
  JSON_Status JVar1;
  
  JVar1 = -1;
  if ((array != (JSON_Array *)0x0) && (JVar1 = -1, ix < array->count)) {
    json_value_free(array->items[ix]);
    memmove(array->items + ix,array->items + ix + 1,(~ix + array->count) * 8);
    array->count = array->count - 1;
    JVar1 = 0;
  }
  return JVar1;
}

Assistant:

JSON_Status json_array_remove(JSON_Array *array, size_t ix) {
    size_t to_move_bytes = 0;
    if (array == NULL || ix >= json_array_get_count(array)) {
        return JSONFailure;
    }
    json_value_free(json_array_get_value(array, ix));
    to_move_bytes = (json_array_get_count(array) - 1 - ix) * sizeof(JSON_Value*);
    memmove(array->items + ix, array->items + ix + 1, to_move_bytes);
    array->count -= 1;
    return JSONSuccess;
}